

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::EqualElement<char_const*>::operator()
          (void *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          basic_string_view<char,_std::char_traits<char>_> *param_2)

{
  size_t __n;
  char *__s1;
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type __rlen;
  
  __n = lhs->_M_len;
  __s1 = lhs->_M_str;
  __s = (char *)**this;
  sVar3 = strlen(__s);
  if (__n == sVar3) {
    if (__n != 0) {
      iVar2 = bcmp(__s1,__s,__n);
      if (iVar2 != 0) goto LAB_0023df9a;
    }
    bVar1 = true;
  }
  else {
LAB_0023df9a:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }